

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O2

void tree_sitter_haskell_external_scanner_deserialize(void *payload,char *buffer,uint length)

{
  uint32_t uVar1;
  undefined8 uVar2;
  char *pcVar3;
  uint32_t *puVar4;
  uint32_t local_48;
  undefined1 auStack_44 [4];
  undefined8 uStack_40;
  undefined4 local_38;
  
  puVar4 = &local_48;
  if (length == 0) {
    pcVar3 = auStack_44;
    local_38 = 0;
    uStack_40 = 0;
    _local_48 = 0x300000000;
  }
  else {
    pcVar3 = buffer + 4;
    puVar4 = (uint32_t *)buffer;
  }
  uVar1 = *puVar4;
  uVar2 = *(undefined8 *)(pcVar3 + 8);
  *(undefined8 *)((long)payload + 0x10) = *(undefined8 *)pcVar3;
  *(undefined8 *)((long)payload + 0x18) = uVar2;
  _array__reserve((Array *)payload,8,*puVar4);
  *(uint32_t *)((long)payload + 8) = *puVar4;
  if (length != 0) {
    memcpy(*payload,buffer + 0x14,(ulong)(uVar1 << 3));
  }
  *(undefined4 *)((long)payload + 0x28) = 0;
  *(undefined4 *)((long)payload + 0x30) = 0;
  _array__reserve((Array *)((long)payload + 0x20),4,8);
  return;
}

Assistant:

void tree_sitter_haskell_external_scanner_deserialize(void *payload, const char *buffer, unsigned length) {
  State *state = (State *) payload;
  Persist p;
  Persist *persist;
  if (length > 0)
    persist = (Persist *) buffer;
  else {
    p = (Persist) {.contexts = 0};
    persist = &p;
    persist->newline.state = NResume;
  }
  unsigned contexts_size = persist->contexts * sizeof(Context);
  state->newline = persist->newline;
  array_reserve(&state->contexts, persist->contexts);
  state->contexts.size = persist->contexts;
  if (length > 0)
    memcpy(state->contexts.contents, buffer + sizeof(Persist), contexts_size);
  state->lookahead.size = 0;
  state->lookahead.offset = 0;
  array_reserve(&state->lookahead, 8);
#ifdef TREE_SITTER_DEBUG
  if (length > 0)
    deserialize_parse_lines(buffer + sizeof(Persist) + contexts_size, &state->parse, persist->parse);
#endif
}